

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImFormatStringToTempBuffer(char **out_buf,char **out_buf_end,char *fmt,...)

{
  ImGuiContext *pIVar1;
  int iVar2;
  size_t in_RCX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  int buf_len;
  va_list args;
  ImGuiContext *g;
  __va_list_tag *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  
  pIVar1 = GImGui;
  iVar2 = ImFormatStringV(in_R8,in_RCX,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  *in_RDI = (pIVar1->TempBuffer).Data;
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = (pIVar1->TempBuffer).Data + iVar2;
  }
  return;
}

Assistant:

void ImFormatStringToTempBuffer(const char** out_buf, const char** out_buf_end, const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    va_list args;
    va_start(args, fmt);
    int buf_len = ImFormatStringV(g.TempBuffer.Data, g.TempBuffer.Size, fmt, args);
    *out_buf = g.TempBuffer.Data;
    if (out_buf_end) { *out_buf_end = g.TempBuffer.Data + buf_len; }
    va_end(args);
}